

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  undefined1 auVar2 [16];
  Ref<embree::Geometry> *pRVar3;
  Geometry *pGVar4;
  long lVar5;
  RTCIntersectArguments *pRVar6;
  bool bVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  long lVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  int iVar25;
  AABBNodeMB4D *node1;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float fVar71;
  undefined4 uVar72;
  undefined1 auVar73 [32];
  float fVar74;
  float fVar77;
  float fVar78;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [64];
  undefined1 auVar81 [32];
  undefined1 auVar82 [64];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  uint uVar90;
  uint uVar91;
  uint uVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar89 [64];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 in_ZMM29 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong *local_1568;
  int local_153c;
  long local_1538;
  Geometry *local_1530;
  ulong local_1528;
  Scene *local_1520;
  long local_1518;
  long local_1510;
  long local_1508;
  undefined4 local_1500;
  undefined4 local_14fc;
  undefined4 local_14f8;
  undefined4 local_14f4;
  undefined4 local_14f0;
  undefined4 local_14ec;
  uint local_14e8;
  uint local_14e4;
  uint local_14e0;
  RTCFilterFunctionNArguments local_14d0;
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  byte local_12df;
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  undefined4 uStack_12a4;
  undefined1 local_12a0 [32];
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  ulong local_1200 [570];
  
  local_1200[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200[0] != 8) {
    fVar74 = ray->tfar;
    vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
    auVar60 = vucomiss_avx512f(ZEXT416((uint)fVar74));
    auVar102 = ZEXT1664(auVar60);
    if (local_1200[0] < 9) {
      local_1568 = local_1200 + 1;
      aVar1 = (ray->dir).field_0.field_1;
      auVar36 = vmaxss_avx512f(auVar60,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar37._8_4_ = 0x7fffffff;
      auVar37._0_8_ = 0x7fffffff7fffffff;
      auVar37._12_4_ = 0x7fffffff;
      auVar37 = vandps_avx512vl((undefined1  [16])aVar1,auVar37);
      auVar54._8_4_ = 0x219392ef;
      auVar54._0_8_ = 0x219392ef219392ef;
      auVar54._12_4_ = 0x219392ef;
      uVar32 = vcmpps_avx512vl(auVar37,auVar54,1);
      bVar7 = (bool)((byte)uVar32 & 1);
      auVar51._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * (int)aVar1.x;
      bVar7 = (bool)((byte)(uVar32 >> 1) & 1);
      auVar51._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * (int)aVar1.y;
      bVar7 = (bool)((byte)(uVar32 >> 2) & 1);
      auVar51._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * (int)aVar1.z;
      bVar7 = (bool)((byte)(uVar32 >> 3) & 1);
      auVar51._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * aVar1.field_3.a;
      auVar37 = vrcp14ps_avx512vl(auVar51);
      auVar38._8_4_ = 0x3f800000;
      auVar38._0_8_ = 0x3f8000003f800000;
      auVar38._12_4_ = 0x3f800000;
      auVar38 = vfnmadd213ps_avx512vl(auVar51,auVar37,auVar38);
      vfmadd132ps_fma(auVar38,auVar37,auVar37);
      auVar38 = vucomiss_avx512f(auVar60);
      auVar63 = vbroadcastss_avx512vl(auVar38);
      auVar103 = ZEXT3264(auVar63);
      auVar37 = vmovshdup_avx(auVar38);
      auVar63 = vbroadcastsd_avx512vl(auVar37);
      auVar104 = ZEXT3264(auVar63);
      vshufpd_avx(auVar38,auVar38,1);
      auVar64._8_4_ = 2;
      auVar64._0_8_ = 0x200000002;
      auVar64._12_4_ = 2;
      auVar64._16_4_ = 2;
      auVar64._20_4_ = 2;
      auVar64._24_4_ = 2;
      auVar64._28_4_ = 2;
      local_13c0 = vpermps_avx2(auVar64,ZEXT1632(auVar38));
      auVar88 = ZEXT3264(local_13c0);
      fVar71 = auVar38._0_4_ * (ray->org).field_0.m128[0];
      auVar63._8_4_ = 1;
      auVar63._0_8_ = 0x100000001;
      auVar63._12_4_ = 1;
      auVar63._16_4_ = 1;
      auVar63._20_4_ = 1;
      auVar63._24_4_ = 1;
      auVar63._28_4_ = 1;
      auVar69 = ZEXT1632(CONCAT412(auVar38._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar38._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar38._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar71))));
      auVar63 = vpermps_avx2(auVar63,auVar69);
      auVar69 = vpermps_avx2(auVar64,auVar69);
      lVar34 = 0;
      vucomiss_avx512f(auVar60);
      lVar35 = 0x40;
      vucomiss_avx512f(auVar60);
      uVar72 = auVar36._0_4_;
      local_13e0._4_4_ = uVar72;
      local_13e0._0_4_ = uVar72;
      local_13e0._8_4_ = uVar72;
      local_13e0._12_4_ = uVar72;
      local_13e0._16_4_ = uVar72;
      local_13e0._20_4_ = uVar72;
      local_13e0._24_4_ = uVar72;
      local_13e0._28_4_ = uVar72;
      auVar80 = ZEXT3264(local_13e0);
      local_1400._4_4_ = fVar74;
      local_1400._0_4_ = fVar74;
      local_1400._8_4_ = fVar74;
      local_1400._12_4_ = fVar74;
      local_1400._16_4_ = fVar74;
      local_1400._20_4_ = fVar74;
      local_1400._24_4_ = fVar74;
      local_1400._28_4_ = fVar74;
      auVar89 = ZEXT3264(local_1400);
      local_1420._0_8_ = CONCAT44(fVar71,fVar71) ^ 0x8000000080000000;
      local_1420._8_4_ = -fVar71;
      local_1420._12_4_ = -fVar71;
      local_1420._16_4_ = -fVar71;
      local_1420._20_4_ = -fVar71;
      local_1420._24_4_ = -fVar71;
      local_1420._28_4_ = -fVar71;
      auVar82 = ZEXT3264(local_1420);
      local_1440._0_8_ = auVar63._0_8_ ^ 0x8000000080000000;
      local_1440._8_4_ = auVar63._8_4_ ^ 0x80000000;
      local_1440._12_4_ = auVar63._12_4_ ^ 0x80000000;
      local_1440._16_4_ = auVar63._16_4_ ^ 0x80000000;
      local_1440._20_4_ = auVar63._20_4_ ^ 0x80000000;
      local_1440._24_4_ = auVar63._24_4_ ^ 0x80000000;
      local_1440._28_4_ = auVar63._28_4_ ^ 0x80000000;
      auVar85 = ZEXT3264(local_1440);
      local_1460._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
      local_1460._8_4_ = auVar69._8_4_ ^ 0x80000000;
      local_1460._12_4_ = auVar69._12_4_ ^ 0x80000000;
      local_1460._16_4_ = auVar69._16_4_ ^ 0x80000000;
      local_1460._20_4_ = auVar69._20_4_ ^ 0x80000000;
      local_1460._24_4_ = auVar69._24_4_ ^ 0x80000000;
      local_1460._28_4_ = auVar69._28_4_ ^ 0x80000000;
      auVar98 = ZEXT3264(local_1460);
      local_1510 = 0;
      local_1518 = 0x40;
LAB_01c70833:
      if (local_1568 != local_1200) {
        uVar32 = local_1568[-1];
        local_1568 = local_1568 + -1;
        do {
          uVar72 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
          auVar69._4_4_ = uVar72;
          auVar69._0_4_ = uVar72;
          auVar69._8_4_ = uVar72;
          auVar69._12_4_ = uVar72;
          auVar69._16_4_ = uVar72;
          auVar69._20_4_ = uVar72;
          auVar69._24_4_ = uVar72;
          auVar69._28_4_ = uVar72;
          do {
            if ((uVar32 & 8) != 0) {
              local_1508 = (ulong)((uint)uVar32 & 0xf) - 8;
              uVar32 = uVar32 & 0xfffffffffffffff0;
              local_1538 = 0;
              goto LAB_01c709bb;
            }
            uVar26 = uVar32 & 0xfffffffffffffff0;
            auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x100 + lVar34),auVar69,
                                      *(undefined1 (*) [32])(uVar26 + 0x40 + lVar34));
            auVar63 = vfmadd213ps_avx512vl(ZEXT1632(auVar60),auVar103._0_32_,auVar82._0_32_);
            auVar63 = vmaxps_avx(auVar80._0_32_,auVar63);
            auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x100 + lVar35),auVar69,
                                      *(undefined1 (*) [32])(uVar26 + 0x40 + lVar35));
            auVar37 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x180),auVar69,
                                      *(undefined1 (*) [32])(uVar26 + 0xc0));
            auVar64 = vfmadd213ps_avx512vl(ZEXT1632(auVar60),auVar104._0_32_,auVar85._0_32_);
            auVar60 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar88._0_32_,auVar98._0_32_);
            auVar64 = vmaxps_avx(auVar64,ZEXT1632(auVar60));
            auVar63 = vmaxps_avx(auVar63,auVar64);
            auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x120),auVar69,
                                      *(undefined1 (*) [32])(uVar26 + 0x60));
            auVar64 = vfmadd213ps_avx512vl(ZEXT1632(auVar60),auVar103._0_32_,auVar82._0_32_);
            auVar64 = vminps_avx(auVar89._0_32_,auVar64);
            auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x160),auVar69,
                                      *(undefined1 (*) [32])(uVar26 + 0xa0));
            auVar37 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x1a0),auVar69,
                                      *(undefined1 (*) [32])(uVar26 + 0xe0));
            auVar65 = vfmadd213ps_avx512vl(ZEXT1632(auVar60),auVar104._0_32_,auVar85._0_32_);
            auVar60 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar88._0_32_,auVar98._0_32_);
            auVar65 = vminps_avx(auVar65,ZEXT1632(auVar60));
            auVar64 = vminps_avx(auVar64,auVar65);
            if (((uint)uVar32 & 7) == 6) {
              uVar10 = vcmpps_avx512vl(auVar63,auVar64,2);
              uVar11 = vcmpps_avx512vl(auVar69,*(undefined1 (*) [32])(uVar26 + 0x1c0),0xd);
              uVar12 = vcmpps_avx512vl(auVar69,*(undefined1 (*) [32])(uVar26 + 0x1e0),1);
              uVar28 = (uint)uVar10 & (uint)uVar11 & (uint)uVar12;
            }
            else {
              uVar10 = vcmpps_avx512vl(auVar63,auVar64,2);
              uVar28 = (uint)uVar10;
            }
            if ((byte)uVar28 == 0) goto LAB_01c70833;
            lVar14 = 0;
            for (uVar32 = (ulong)(byte)uVar28; (uVar32 & 1) == 0;
                uVar32 = uVar32 >> 1 | 0x8000000000000000) {
              lVar14 = lVar14 + 1;
            }
            uVar32 = *(ulong *)(uVar26 + lVar14 * 8);
            uVar28 = (uVar28 & 0xff) - 1 & uVar28 & 0xff;
            uVar29 = (ulong)uVar28;
          } while (uVar28 == 0);
          do {
            *local_1568 = uVar32;
            local_1568 = local_1568 + 1;
            lVar14 = 0;
            for (uVar32 = uVar29; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
              lVar14 = lVar14 + 1;
            }
            uVar29 = uVar29 - 1 & uVar29;
            uVar32 = *(ulong *)(uVar26 + lVar14 * 8);
          } while (uVar29 != 0);
        } while( true );
      }
    }
  }
  return;
LAB_01c709bb:
  if (local_1538 == local_1508) goto LAB_01c70833;
  lVar35 = local_1538 * 0x60;
  local_1520 = context->scene;
  pRVar3 = (context->scene->geometries).items;
  pGVar4 = pRVar3[*(uint *)(uVar32 + 0x40 + lVar35)].ptr;
  fVar74 = (pGVar4->time_range).lower;
  fVar74 = pGVar4->fnumTimeSegments *
           (((ray->dir).field_0.m128[3] - fVar74) / ((pGVar4->time_range).upper - fVar74));
  auVar60 = vroundss_avx(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74),9);
  auVar60 = vminss_avx(auVar60,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
  auVar39 = vmaxss_avx512f(auVar102._0_16_,auVar60);
  iVar25 = (int)auVar39._0_4_;
  lVar30 = (long)iVar25 * 0x38;
  lVar34 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar30);
  auVar60 = *(undefined1 (*) [16])(lVar34 + (ulong)*(uint *)(uVar32 + lVar35) * 4);
  uVar29 = (ulong)*(uint *)(uVar32 + 0x10 + lVar35);
  auVar37 = *(undefined1 (*) [16])(lVar34 + uVar29 * 4);
  uVar31 = (ulong)*(uint *)(uVar32 + 0x20 + lVar35);
  auVar38 = *(undefined1 (*) [16])(lVar34 + uVar31 * 4);
  uVar33 = (ulong)*(uint *)(uVar32 + 0x30 + lVar35);
  auVar36 = *(undefined1 (*) [16])(lVar34 + uVar33 * 4);
  uVar26 = CONCAT44(0,*(uint *)(uVar32 + 4 + lVar35));
  local_1480._0_8_ = uVar26;
  lVar27 = (long)(iVar25 + 1) * 0x38;
  local_14a0._0_8_ = lVar27;
  lVar34 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar27);
  auVar51 = *(undefined1 (*) [16])(lVar34 + (ulong)*(uint *)(uVar32 + lVar35) * 4);
  auVar54 = *(undefined1 (*) [16])(lVar34 + uVar29 * 4);
  lVar14 = *(long *)&pRVar3[*(uint *)(uVar32 + 0x44 + lVar35)].ptr[2].numPrimitives;
  lVar5 = *(long *)(lVar14 + lVar30);
  auVar43 = *(undefined1 (*) [16])(lVar5 + uVar26 * 4);
  auVar57 = *(undefined1 (*) [16])(lVar34 + uVar31 * 4);
  uVar31 = (ulong)*(uint *)(uVar32 + 0x14 + lVar35);
  auVar45 = *(undefined1 (*) [16])(lVar5 + uVar31 * 4);
  auVar61 = *(undefined1 (*) [16])(lVar34 + uVar33 * 4);
  uVar29 = (ulong)*(uint *)(uVar32 + 0x24 + lVar35);
  auVar48 = *(undefined1 (*) [16])(lVar5 + uVar29 * 4);
  uVar33 = (ulong)*(uint *)(uVar32 + 0x34 + lVar35);
  auVar50 = *(undefined1 (*) [16])(lVar5 + uVar33 * 4);
  lVar34 = *(long *)&pRVar3[*(uint *)(uVar32 + 0x48 + lVar35)].ptr[2].numPrimitives;
  lVar14 = *(long *)(lVar14 + lVar27);
  auVar53 = *(undefined1 (*) [16])(lVar14 + uVar26 * 4);
  lVar5 = *(long *)(lVar34 + lVar30);
  auVar56 = *(undefined1 (*) [16])(lVar14 + uVar31 * 4);
  uVar31 = (ulong)*(uint *)(uVar32 + 8 + lVar35);
  auVar2 = *(undefined1 (*) [16])(lVar5 + uVar31 * 4);
  auVar58 = *(undefined1 (*) [16])(lVar14 + uVar29 * 4);
  uVar29 = (ulong)*(uint *)(uVar32 + 0x18 + lVar35);
  auVar44 = *(undefined1 (*) [16])(lVar5 + uVar29 * 4);
  auVar62 = *(undefined1 (*) [16])(lVar14 + uVar33 * 4);
  uVar26 = (ulong)*(uint *)(uVar32 + 0x28 + lVar35);
  auVar47 = *(undefined1 (*) [16])(lVar5 + uVar26 * 4);
  uVar33 = (ulong)*(uint *)(uVar32 + 0x38 + lVar35);
  auVar49 = *(undefined1 (*) [16])(lVar5 + uVar33 * 4);
  lVar34 = *(long *)(lVar34 + lVar27);
  auVar52 = *(undefined1 (*) [16])(lVar34 + uVar31 * 4);
  lVar14 = *(long *)&pRVar3[*(uint *)(uVar32 + 0x4c + lVar35)].ptr[2].numPrimitives;
  lVar5 = *(long *)(lVar14 + lVar30);
  auVar55 = *(undefined1 (*) [16])(lVar34 + uVar29 * 4);
  uVar29 = (ulong)*(uint *)(uVar32 + 0xc + lVar35);
  auVar41 = *(undefined1 (*) [16])(lVar5 + uVar29 * 4);
  auVar59 = *(undefined1 (*) [16])(lVar34 + uVar26 * 4);
  uVar31 = (ulong)*(uint *)(uVar32 + 0x1c + lVar35);
  auVar46 = *(undefined1 (*) [16])(lVar5 + uVar31 * 4);
  auVar40 = vunpcklps_avx512vl(auVar60,auVar2);
  auVar2 = vunpckhps_avx(auVar60,auVar2);
  auVar42 = vunpcklps_avx(auVar43,auVar41);
  auVar43 = vunpckhps_avx(auVar43,auVar41);
  auVar60 = *(undefined1 (*) [16])(lVar34 + uVar33 * 4);
  uVar26 = (ulong)*(uint *)(uVar32 + 0x2c + lVar35);
  auVar2 = vunpcklps_avx(auVar2,auVar43);
  auVar41 = vunpcklps_avx512vl(auVar40,auVar42);
  auVar42 = vunpckhps_avx512vl(auVar40,auVar42);
  auVar43 = vunpcklps_avx512vl(auVar37,auVar44);
  auVar44 = vunpckhps_avx512vl(auVar37,auVar44);
  auVar40 = vunpcklps_avx512vl(auVar45,auVar46);
  auVar45 = vunpckhps_avx512vl(auVar45,auVar46);
  auVar37 = *(undefined1 (*) [16])(lVar5 + uVar26 * 4);
  uVar33 = (ulong)*(uint *)(uVar32 + 0x3c + lVar35);
  auVar45 = vunpcklps_avx(auVar44,auVar45);
  auVar44 = vunpcklps_avx512vl(auVar43,auVar40);
  auVar43 = vunpckhps_avx(auVar43,auVar40);
  auVar46 = vunpcklps_avx512vl(auVar38,auVar47);
  auVar47 = vunpckhps_avx512vl(auVar38,auVar47);
  auVar40 = vunpcklps_avx512vl(auVar48,auVar37);
  auVar38 = vunpckhps_avx(auVar48,auVar37);
  auVar37 = *(undefined1 (*) [16])(lVar5 + uVar33 * 4);
  lVar34 = *(long *)(lVar14 + lVar27);
  auVar38 = vunpcklps_avx(auVar47,auVar38);
  auVar48 = vunpcklps_avx512vl(auVar46,auVar40);
  auVar47 = vunpckhps_avx512vl(auVar46,auVar40);
  auVar46 = vunpcklps_avx512vl(auVar36,auVar49);
  auVar36 = vunpckhps_avx512vl(auVar36,auVar49);
  auVar49 = vunpcklps_avx512vl(auVar50,auVar37);
  auVar50 = vunpckhps_avx512vl(auVar50,auVar37);
  auVar37 = *(undefined1 (*) [16])(lVar34 + uVar29 * 4);
  auVar36 = vunpcklps_avx(auVar36,auVar50);
  auVar50 = vunpcklps_avx512vl(auVar46,auVar49);
  auVar49 = vunpckhps_avx512vl(auVar46,auVar49);
  auVar46 = vunpcklps_avx512vl(auVar51,auVar52);
  auVar51 = vunpckhps_avx512vl(auVar51,auVar52);
  auVar52 = vunpcklps_avx512vl(auVar53,auVar37);
  auVar53 = vunpckhps_avx512vl(auVar53,auVar37);
  auVar37 = *(undefined1 (*) [16])(lVar34 + uVar31 * 4);
  auVar53 = vunpcklps_avx512vl(auVar51,auVar53);
  auVar40 = vunpcklps_avx512vl(auVar46,auVar52);
  auVar52 = vunpckhps_avx512vl(auVar46,auVar52);
  auVar51 = vunpcklps_avx512vl(auVar54,auVar55);
  auVar54 = vunpckhps_avx512vl(auVar54,auVar55);
  auVar55 = vunpcklps_avx512vl(auVar56,auVar37);
  auVar56 = vunpckhps_avx512vl(auVar56,auVar37);
  auVar37 = *(undefined1 (*) [16])(lVar34 + uVar26 * 4);
  auVar54 = vunpcklps_avx512vl(auVar54,auVar56);
  auVar56 = vunpcklps_avx512vl(auVar51,auVar55);
  auVar55 = vunpckhps_avx512vl(auVar51,auVar55);
  auVar46 = vunpcklps_avx512vl(auVar57,auVar59);
  auVar51 = vunpckhps_avx512vl(auVar57,auVar59);
  auVar57 = vunpcklps_avx512vl(auVar58,auVar37);
  auVar58 = vunpckhps_avx512vl(auVar58,auVar37);
  auVar37 = *(undefined1 (*) [16])(lVar34 + uVar33 * 4);
  auVar51 = vunpcklps_avx(auVar51,auVar58);
  auVar58 = vunpcklps_avx512vl(auVar46,auVar57);
  auVar57 = vunpckhps_avx512vl(auVar46,auVar57);
  auVar59 = vunpcklps_avx512vl(auVar61,auVar60);
  auVar60 = vunpckhps_avx512vl(auVar61,auVar60);
  auVar61 = vunpcklps_avx512vl(auVar62,auVar37);
  auVar37 = vunpckhps_avx512vl(auVar62,auVar37);
  auVar60 = vunpcklps_avx(auVar60,auVar37);
  auVar62 = vunpcklps_avx512vl(auVar59,auVar61);
  auVar61 = vunpckhps_avx512vl(auVar59,auVar61);
  auVar37 = ZEXT416((uint)(fVar74 - auVar39._0_4_));
  auVar59 = vbroadcastss_avx512vl(auVar37);
  auVar37 = vsubss_avx512f(ZEXT416(0x3f800000),auVar37);
  auVar46._0_4_ = auVar37._0_4_;
  auVar46._4_4_ = auVar46._0_4_;
  auVar46._8_4_ = auVar46._0_4_;
  auVar46._12_4_ = auVar46._0_4_;
  auVar37 = vmulps_avx512vl(auVar59,auVar40);
  auVar41 = vfmadd231ps_avx512vl(auVar37,auVar46,auVar41);
  auVar37 = vmulps_avx512vl(auVar59,auVar52);
  auVar52 = vfmadd231ps_avx512vl(auVar37,auVar46,auVar42);
  auVar37 = vmulps_avx512vl(auVar59,auVar53);
  auVar37 = vfmadd231ps_fma(auVar37,auVar46,auVar2);
  auVar53 = vmulps_avx512vl(auVar59,auVar56);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar46,auVar44);
  auVar56 = vmulps_avx512vl(auVar59,auVar55);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar46,auVar43);
  auVar54 = vmulps_avx512vl(auVar59,auVar54);
  auVar54 = vfmadd231ps_fma(auVar54,auVar46,auVar45);
  auVar43 = vmulps_avx512vl(auVar59,auVar58);
  auVar43 = vfmadd231ps_fma(auVar43,auVar46,auVar48);
  auVar57 = vmulps_avx512vl(auVar59,auVar57);
  auVar57 = vfmadd231ps_fma(auVar57,auVar46,auVar47);
  auVar51 = vmulps_avx512vl(auVar59,auVar51);
  auVar38 = vfmadd231ps_fma(auVar51,auVar46,auVar38);
  auVar51 = vmulps_avx512vl(auVar59,auVar62);
  auVar45 = vmulps_avx512vl(auVar59,auVar61);
  auVar61 = vmulps_avx512vl(auVar59,auVar60);
  auVar60 = vfmadd231ps_fma(auVar51,auVar46,auVar50);
  lVar34 = uVar32 + 0x40 + lVar35;
  local_1380 = *(undefined8 *)(lVar34 + 0x10);
  uStack_1378 = *(undefined8 *)(lVar34 + 0x18);
  auVar51 = vfmadd231ps_fma(auVar45,auVar46,auVar49);
  uStack_1370 = local_1380;
  uStack_1368 = uStack_1378;
  lVar35 = uVar32 + 0x50 + lVar35;
  local_13a0 = *(undefined8 *)(lVar35 + 0x10);
  uStack_1398 = *(undefined8 *)(lVar35 + 0x18);
  auVar36 = vfmadd231ps_fma(auVar61,auVar46,auVar36);
  uStack_1390 = local_13a0;
  uStack_1388 = uStack_1398;
  auVar66 = vinsertf32x4_avx512vl(ZEXT1632(auVar41),auVar43,1);
  auVar67 = vinsertf32x4_avx512vl(ZEXT1632(auVar52),auVar57,1);
  auVar83._16_16_ = auVar38;
  auVar83._0_16_ = auVar37;
  auVar70._16_16_ = auVar53;
  auVar70._0_16_ = auVar53;
  auVar68 = vinsertf32x4_avx512vl(ZEXT1632(auVar56),auVar56,1);
  auVar79._16_16_ = auVar54;
  auVar79._0_16_ = auVar54;
  auVar73._16_16_ = auVar60;
  auVar73._0_16_ = auVar60;
  auVar86._16_16_ = auVar51;
  auVar86._0_16_ = auVar51;
  auVar81._16_16_ = auVar36;
  auVar81._0_16_ = auVar36;
  auVar63 = vsubps_avx(auVar66,auVar70);
  auVar69 = vsubps_avx(auVar67,auVar68);
  auVar64 = vsubps_avx(auVar83,auVar79);
  auVar65 = vsubps_avx(auVar73,auVar66);
  auVar8 = vsubps_avx(auVar86,auVar67);
  auVar9 = vsubps_avx(auVar81,auVar83);
  auVar19._4_4_ = auVar69._4_4_ * auVar9._4_4_;
  auVar19._0_4_ = auVar69._0_4_ * auVar9._0_4_;
  auVar19._8_4_ = auVar69._8_4_ * auVar9._8_4_;
  auVar19._12_4_ = auVar69._12_4_ * auVar9._12_4_;
  auVar19._16_4_ = auVar69._16_4_ * auVar9._16_4_;
  auVar19._20_4_ = auVar69._20_4_ * auVar9._20_4_;
  auVar19._24_4_ = auVar69._24_4_ * auVar9._24_4_;
  auVar19._28_4_ = auVar53._12_4_;
  auVar36 = vfmsub231ps_fma(auVar19,auVar8,auVar64);
  auVar20._4_4_ = auVar65._4_4_ * auVar64._4_4_;
  auVar20._0_4_ = auVar65._0_4_ * auVar64._0_4_;
  auVar20._8_4_ = auVar65._8_4_ * auVar64._8_4_;
  auVar20._12_4_ = auVar65._12_4_ * auVar64._12_4_;
  auVar20._16_4_ = auVar65._16_4_ * auVar64._16_4_;
  auVar20._20_4_ = auVar65._20_4_ * auVar64._20_4_;
  auVar20._24_4_ = auVar65._24_4_ * auVar64._24_4_;
  auVar20._28_4_ = auVar68._28_4_;
  fVar74 = (ray->dir).field_0.m128[0];
  auVar99._4_4_ = fVar74;
  auVar99._0_4_ = fVar74;
  auVar99._8_4_ = fVar74;
  auVar99._12_4_ = fVar74;
  auVar99._16_4_ = fVar74;
  auVar99._20_4_ = fVar74;
  auVar99._24_4_ = fVar74;
  auVar99._28_4_ = fVar74;
  fVar71 = (ray->dir).field_0.m128[1];
  auVar100._4_4_ = fVar71;
  auVar100._0_4_ = fVar71;
  auVar100._8_4_ = fVar71;
  auVar100._12_4_ = fVar71;
  auVar100._16_4_ = fVar71;
  auVar100._20_4_ = fVar71;
  auVar100._24_4_ = fVar71;
  auVar100._28_4_ = fVar71;
  fVar93 = (ray->dir).field_0.m128[2];
  auVar101._4_4_ = fVar93;
  auVar101._0_4_ = fVar93;
  auVar101._8_4_ = fVar93;
  auVar101._12_4_ = fVar93;
  auVar101._16_4_ = fVar93;
  auVar101._20_4_ = fVar93;
  auVar101._24_4_ = fVar93;
  auVar101._28_4_ = fVar93;
  uVar72 = *(undefined4 *)&(ray->org).field_0;
  auVar68._4_4_ = uVar72;
  auVar68._0_4_ = uVar72;
  auVar68._8_4_ = uVar72;
  auVar68._12_4_ = uVar72;
  auVar68._16_4_ = uVar72;
  auVar68._20_4_ = uVar72;
  auVar68._24_4_ = uVar72;
  auVar68._28_4_ = uVar72;
  auVar68 = vsubps_avx512vl(auVar66,auVar68);
  uVar72 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar66._4_4_ = uVar72;
  auVar66._0_4_ = uVar72;
  auVar66._8_4_ = uVar72;
  auVar66._12_4_ = uVar72;
  auVar66._16_4_ = uVar72;
  auVar66._20_4_ = uVar72;
  auVar66._24_4_ = uVar72;
  auVar66._28_4_ = uVar72;
  auVar66 = vsubps_avx512vl(auVar67,auVar66);
  auVar51 = vfmsub231ps_fma(auVar20,auVar9,auVar63);
  uVar72 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar15._4_4_ = uVar72;
  auVar15._0_4_ = uVar72;
  auVar15._8_4_ = uVar72;
  auVar15._12_4_ = uVar72;
  auVar15._16_4_ = uVar72;
  auVar15._20_4_ = uVar72;
  auVar15._24_4_ = uVar72;
  auVar15._28_4_ = uVar72;
  local_1300 = vsubps_avx512vl(auVar83,auVar15);
  auVar21._4_4_ = fVar74 * auVar66._4_4_;
  auVar21._0_4_ = fVar74 * auVar66._0_4_;
  auVar21._8_4_ = fVar74 * auVar66._8_4_;
  auVar21._12_4_ = fVar74 * auVar66._12_4_;
  auVar21._16_4_ = fVar74 * auVar66._16_4_;
  auVar21._20_4_ = fVar74 * auVar66._20_4_;
  auVar21._24_4_ = fVar74 * auVar66._24_4_;
  auVar21._28_4_ = auVar67._28_4_;
  auVar60 = vfmsub231ps_fma(auVar21,auVar68,auVar100);
  auVar67._4_4_ = auVar9._4_4_ * auVar60._4_4_;
  auVar67._0_4_ = auVar9._0_4_ * auVar60._0_4_;
  auVar67._8_4_ = auVar9._8_4_ * auVar60._8_4_;
  auVar67._12_4_ = auVar9._12_4_ * auVar60._12_4_;
  auVar67._16_4_ = auVar9._16_4_ * 0.0;
  auVar67._20_4_ = auVar9._20_4_ * 0.0;
  auVar67._24_4_ = auVar9._24_4_ * 0.0;
  auVar67._28_4_ = auVar38._12_4_;
  auVar22._4_4_ = auVar64._4_4_ * auVar60._4_4_;
  auVar22._0_4_ = auVar64._0_4_ * auVar60._0_4_;
  auVar22._8_4_ = auVar64._8_4_ * auVar60._8_4_;
  auVar22._12_4_ = auVar64._12_4_ * auVar60._12_4_;
  auVar22._16_4_ = auVar64._16_4_ * 0.0;
  auVar22._20_4_ = auVar64._20_4_ * 0.0;
  auVar22._24_4_ = auVar64._24_4_ * 0.0;
  auVar22._28_4_ = auVar9._28_4_;
  auVar75._0_4_ = fVar93 * auVar68._0_4_;
  auVar75._4_4_ = fVar93 * auVar68._4_4_;
  auVar75._8_4_ = fVar93 * auVar68._8_4_;
  auVar75._12_4_ = fVar93 * auVar68._12_4_;
  auVar75._16_4_ = fVar93 * auVar68._16_4_;
  auVar75._20_4_ = fVar93 * auVar68._20_4_;
  auVar75._24_4_ = fVar93 * auVar68._24_4_;
  auVar75._28_4_ = 0;
  auVar37 = vfmsub231ps_fma(auVar75,local_1300,auVar99);
  auVar60 = vfmadd231ps_fma(auVar67,ZEXT1632(auVar37),auVar8);
  auVar37 = vfmadd231ps_fma(auVar22,auVar69,ZEXT1632(auVar37));
  auVar9._4_4_ = auVar63._4_4_ * auVar8._4_4_;
  auVar9._0_4_ = auVar63._0_4_ * auVar8._0_4_;
  auVar9._8_4_ = auVar63._8_4_ * auVar8._8_4_;
  auVar9._12_4_ = auVar63._12_4_ * auVar8._12_4_;
  auVar9._16_4_ = auVar63._16_4_ * auVar8._16_4_;
  auVar9._20_4_ = auVar63._20_4_ * auVar8._20_4_;
  auVar9._24_4_ = auVar63._24_4_ * auVar8._24_4_;
  auVar9._28_4_ = auVar64._28_4_;
  auVar38 = vfmsub231ps_fma(auVar9,auVar65,auVar69);
  auVar76._0_4_ = fVar71 * local_1300._0_4_;
  auVar76._4_4_ = fVar71 * local_1300._4_4_;
  auVar76._8_4_ = fVar71 * local_1300._8_4_;
  auVar76._12_4_ = fVar71 * local_1300._12_4_;
  auVar76._16_4_ = fVar71 * local_1300._16_4_;
  auVar76._20_4_ = fVar71 * local_1300._20_4_;
  auVar76._24_4_ = fVar71 * local_1300._24_4_;
  auVar76._28_4_ = 0;
  auVar54 = vfmsub231ps_fma(auVar76,auVar66,auVar101);
  fVar74 = auVar38._0_4_;
  fVar71 = auVar38._4_4_;
  auVar23._4_4_ = fVar93 * fVar71;
  auVar23._0_4_ = fVar93 * fVar74;
  fVar77 = auVar38._8_4_;
  auVar23._8_4_ = fVar93 * fVar77;
  fVar78 = auVar38._12_4_;
  auVar23._12_4_ = fVar93 * fVar78;
  auVar23._16_4_ = fVar93 * 0.0;
  auVar23._20_4_ = fVar93 * 0.0;
  auVar23._24_4_ = fVar93 * 0.0;
  auVar23._28_4_ = auVar69._28_4_;
  auVar38 = vfmadd231ps_fma(auVar23,ZEXT1632(auVar51),auVar100);
  auVar38 = vfmadd231ps_fma(ZEXT1632(auVar38),ZEXT1632(auVar36),auVar99);
  auVar60 = vfmadd231ps_fma(ZEXT1632(auVar60),ZEXT1632(auVar54),auVar65);
  auVar37 = vfmadd231ps_fma(ZEXT1632(auVar37),auVar63,ZEXT1632(auVar54));
  auVar65._8_4_ = 0x7fffffff;
  auVar65._0_8_ = 0x7fffffff7fffffff;
  auVar65._12_4_ = 0x7fffffff;
  auVar65._16_4_ = 0x7fffffff;
  auVar65._20_4_ = 0x7fffffff;
  auVar65._24_4_ = 0x7fffffff;
  auVar65._28_4_ = 0x7fffffff;
  vandps_avx512vl(ZEXT1632(auVar38),auVar65);
  auVar8._8_4_ = 0x80000000;
  auVar8._0_8_ = 0x8000000080000000;
  auVar8._12_4_ = 0x80000000;
  auVar8._16_4_ = 0x80000000;
  auVar8._20_4_ = 0x80000000;
  auVar8._24_4_ = 0x80000000;
  auVar8._28_4_ = 0x80000000;
  auVar63 = vandpd_avx512vl(ZEXT1632(auVar38),auVar8);
  uVar28 = auVar63._0_4_;
  auVar84._0_4_ = (float)(uVar28 ^ auVar60._0_4_);
  uVar90 = auVar63._4_4_;
  auVar84._4_4_ = (float)(uVar90 ^ auVar60._4_4_);
  uVar91 = auVar63._8_4_;
  auVar84._8_4_ = (float)(uVar91 ^ auVar60._8_4_);
  uVar92 = auVar63._12_4_;
  auVar84._12_4_ = (float)(uVar92 ^ auVar60._12_4_);
  fVar93 = auVar63._16_4_;
  auVar84._16_4_ = fVar93;
  fVar94 = auVar63._20_4_;
  auVar84._20_4_ = fVar94;
  fVar95 = auVar63._24_4_;
  auVar84._24_4_ = fVar95;
  fVar96 = auVar63._28_4_;
  auVar84._28_4_ = fVar96;
  auVar87._0_4_ = (float)(uVar28 ^ auVar37._0_4_);
  auVar87._4_4_ = (float)(uVar90 ^ auVar37._4_4_);
  auVar87._8_4_ = (float)(uVar91 ^ auVar37._8_4_);
  auVar87._12_4_ = (float)(uVar92 ^ auVar37._12_4_);
  auVar87._16_4_ = fVar93;
  auVar87._20_4_ = fVar94;
  auVar87._24_4_ = fVar95;
  auVar87._28_4_ = fVar96;
  uVar10 = vcmpps_avx512vl(auVar84,ZEXT832(0) << 0x20,5);
  uVar11 = vcmpps_avx512vl(auVar87,ZEXT832(0) << 0x20,5);
  uVar12 = vcmpps_avx512vl(ZEXT1632(auVar38),ZEXT832(0) << 0x20,4);
  auVar97._0_4_ = auVar87._0_4_ + auVar84._0_4_;
  auVar97._4_4_ = auVar87._4_4_ + auVar84._4_4_;
  auVar97._8_4_ = auVar87._8_4_ + auVar84._8_4_;
  auVar97._12_4_ = auVar87._12_4_ + auVar84._12_4_;
  auVar97._16_4_ = fVar93 + fVar93;
  auVar97._20_4_ = fVar94 + fVar94;
  auVar97._24_4_ = fVar95 + fVar95;
  auVar97._28_4_ = fVar96 + fVar96;
  uVar13 = vcmpps_avx512vl(auVar97,local_1300,2);
  local_12df = (byte)uVar10 & (byte)uVar11 & (byte)uVar12 & (byte)uVar13;
  if (local_12df != 0) {
    auVar24._4_4_ = fVar71 * local_1300._4_4_;
    auVar24._0_4_ = fVar74 * local_1300._0_4_;
    auVar24._8_4_ = fVar77 * local_1300._8_4_;
    auVar24._12_4_ = fVar78 * local_1300._12_4_;
    auVar24._16_4_ = local_1300._16_4_ * 0.0;
    auVar24._20_4_ = local_1300._20_4_ * 0.0;
    auVar24._24_4_ = local_1300._24_4_ * 0.0;
    auVar24._28_4_ = local_1300._28_4_;
    auVar60 = vfmadd213ps_fma(auVar66,ZEXT1632(auVar51),auVar24);
    auVar60 = vfmadd213ps_fma(auVar68,ZEXT1632(auVar36),ZEXT1632(auVar60));
    local_1320._0_4_ = (float)(uVar28 ^ auVar60._0_4_);
    local_1320._4_4_ = (float)(uVar90 ^ auVar60._4_4_);
    local_1320._8_4_ = (float)(uVar91 ^ auVar60._8_4_);
    local_1320._12_4_ = (float)(uVar92 ^ auVar60._12_4_);
    local_1320._16_4_ = fVar93;
    local_1320._20_4_ = fVar94;
    local_1320._24_4_ = fVar95;
    local_1320._28_4_ = fVar96;
    uVar72 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
    auVar16._4_4_ = uVar72;
    auVar16._0_4_ = uVar72;
    auVar16._8_4_ = uVar72;
    auVar16._12_4_ = uVar72;
    auVar16._16_4_ = uVar72;
    auVar16._20_4_ = uVar72;
    auVar16._24_4_ = uVar72;
    auVar16._28_4_ = uVar72;
    auVar63 = vmulps_avx512vl(local_1300,auVar16);
    uVar10 = vcmpps_avx512vl(auVar63,local_1320,1);
    fVar96 = ray->tfar;
    auVar17._4_4_ = fVar96;
    auVar17._0_4_ = fVar96;
    auVar17._8_4_ = fVar96;
    auVar17._12_4_ = fVar96;
    auVar17._16_4_ = fVar96;
    auVar17._20_4_ = fVar96;
    auVar17._24_4_ = fVar96;
    auVar17._28_4_ = fVar96;
    auVar63 = vmulps_avx512vl(local_1300,auVar17);
    uVar11 = vcmpps_avx512vl(local_1320,auVar63,2);
    local_12df = (byte)uVar10 & (byte)uVar11 & local_12df;
    if (local_12df != 0) {
      auVar63 = vsubps_avx(local_1300,auVar87);
      local_1360 = vblendps_avx(auVar84,auVar63,0xf0);
      auVar63 = vsubps_avx(local_1300,auVar84);
      local_1340 = vblendps_avx(auVar87,auVar63,0xf0);
      local_1260._0_4_ = auVar36._0_4_ * 1.0;
      local_1260._4_4_ = auVar36._4_4_ * 1.0;
      local_1260._8_4_ = auVar36._8_4_ * 1.0;
      local_1260._12_4_ = auVar36._12_4_ * 1.0;
      local_1260._16_4_ = 0x80000000;
      local_1260._20_4_ = 0x80000000;
      local_1260._24_4_ = 0x80000000;
      local_1260._28_4_ = 0;
      local_1240._4_4_ = auVar51._4_4_ * 1.0;
      local_1240._0_4_ = auVar51._0_4_ * 1.0;
      local_1240._8_4_ = auVar51._8_4_ * 1.0;
      local_1240._12_4_ = auVar51._12_4_ * 1.0;
      local_1240._16_4_ = 0x80000000;
      local_1240._20_4_ = 0x80000000;
      local_1240._24_4_ = 0x80000000;
      local_1240._28_4_ = 0;
      local_1220._4_4_ = fVar71 * 1.0;
      local_1220._0_4_ = fVar74 * 1.0;
      local_1220._8_4_ = fVar77 * 1.0;
      local_1220._12_4_ = fVar78 * 1.0;
      local_1220._16_4_ = 0x80000000;
      local_1220._20_4_ = 0x80000000;
      local_1220._24_4_ = 0x80000000;
      local_1220._28_4_ = 0;
      auVar63 = vrcp14ps_avx512vl(local_1300);
      auVar18._8_4_ = 0x3f800000;
      auVar18._0_8_ = 0x3f8000003f800000;
      auVar18._12_4_ = 0x3f800000;
      auVar18._16_4_ = 0x3f800000;
      auVar18._20_4_ = 0x3f800000;
      auVar18._24_4_ = 0x3f800000;
      auVar18._28_4_ = 0x3f800000;
      auVar69 = vfnmadd213ps_avx512vl(local_1300,auVar63,auVar18);
      auVar60 = vfmadd132ps_fma(auVar69,auVar63,auVar63);
      fVar74 = auVar60._0_4_;
      fVar71 = auVar60._4_4_;
      fVar77 = auVar60._8_4_;
      fVar78 = auVar60._12_4_;
      uStack_1264 = auVar63._28_4_;
      local_1280[0] = fVar74 * local_1320._0_4_;
      local_1280[1] = fVar71 * local_1320._4_4_;
      local_1280[2] = fVar77 * local_1320._8_4_;
      local_1280[3] = fVar78 * local_1320._12_4_;
      fStack_1270 = fVar93 * 0.0;
      fStack_126c = fVar94 * 0.0;
      fStack_1268 = fVar95 * 0.0;
      local_12c0[0] = local_1360._0_4_ * fVar74;
      local_12c0[1] = local_1360._4_4_ * fVar71;
      local_12c0[2] = local_1360._8_4_ * fVar77;
      local_12c0[3] = local_1360._12_4_ * fVar78;
      fStack_12b0 = local_1360._16_4_ * 0.0;
      fStack_12ac = local_1360._20_4_ * 0.0;
      fStack_12a8 = local_1360._24_4_ * 0.0;
      uStack_12a4 = uStack_1264;
      local_12a0._4_4_ = local_1340._4_4_ * fVar71;
      local_12a0._0_4_ = local_1340._0_4_ * fVar74;
      local_12a0._8_4_ = local_1340._8_4_ * fVar77;
      local_12a0._12_4_ = local_1340._12_4_ * fVar78;
      local_12a0._16_4_ = local_1340._16_4_ * 0.0;
      local_12a0._20_4_ = local_1340._20_4_ * 0.0;
      local_12a0._24_4_ = local_1340._24_4_ * 0.0;
      local_12a0._28_4_ = uStack_1264;
      uVar26 = (ulong)local_12df;
      do {
        auVar60 = auVar102._0_16_;
        local_1528 = 0;
        for (uVar29 = uVar26; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
          local_1528 = local_1528 + 1;
        }
        local_14e8 = *(uint *)((long)&local_1380 + local_1528 * 4);
        local_1530 = (local_1520->geometries).items[local_14e8].ptr;
        if ((local_1530->mask & ray->mask) != 0) {
          pRVar6 = context->args;
          if ((pRVar6->filter == (RTCFilterFunctionN)0x0) &&
             (local_1530->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01c7127c:
            ray->tfar = -INFINITY;
            return;
          }
          local_1480 = auVar104._0_32_;
          local_14a0 = auVar103._0_32_;
          uVar29 = (ulong)(uint)((int)local_1528 * 4);
          local_14d0.context = context->user;
          local_1500 = *(undefined4 *)(local_1260 + uVar29);
          local_14fc = *(undefined4 *)(local_1240 + uVar29);
          local_14f8 = *(undefined4 *)(local_1220 + uVar29);
          local_14f4 = *(undefined4 *)((long)local_12c0 + uVar29);
          local_14f0 = *(undefined4 *)(local_12a0 + uVar29);
          local_14ec = *(undefined4 *)((long)&local_13a0 + uVar29);
          local_14e4 = (local_14d0.context)->instID[0];
          local_14e0 = (local_14d0.context)->instPrimID[0];
          fVar74 = ray->tfar;
          ray->tfar = *(float *)((long)local_1280 + uVar29);
          local_153c = -1;
          local_14d0.valid = &local_153c;
          local_14d0.geometryUserPtr = local_1530->userPtr;
          local_14d0.hit = (RTCHitN *)&local_1500;
          local_14d0.N = 1;
          local_14d0.ray = (RTCRayN *)ray;
          if (((local_1530->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
              ((*local_1530->occlusionFilterN)(&local_14d0), *local_14d0.valid != 0)) &&
             ((pRVar6->filter == (RTCFilterFunctionN)0x0 ||
              ((((pRVar6->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT && (((local_1530->field_8).field_0x2 & 0x40) == 0))
               || ((*pRVar6->filter)(&local_14d0), *local_14d0.valid != 0)))))) goto LAB_01c7127c;
          ray->tfar = fVar74;
          auVar60 = vxorps_avx512vl(auVar60,auVar60);
          auVar102 = ZEXT1664(auVar60);
          auVar103 = ZEXT3264(local_14a0);
          auVar104 = ZEXT3264(local_1480);
        }
        uVar26 = uVar26 ^ 1L << (local_1528 & 0x3f);
      } while (uVar26 != 0);
    }
  }
  local_1538 = local_1538 + 1;
  auVar88 = ZEXT3264(local_13c0);
  auVar80 = ZEXT3264(local_13e0);
  auVar89 = ZEXT3264(local_1400);
  auVar82 = ZEXT3264(local_1420);
  auVar85 = ZEXT3264(local_1440);
  auVar98 = ZEXT3264(local_1460);
  lVar34 = local_1510;
  lVar35 = local_1518;
  goto LAB_01c709bb;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }